

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void __thiscall DBaseStatusBar::DetachAllMessages(DBaseStatusBar *this)

{
  DHUDMessage *pDVar1;
  DHUDMessage *pDVar2;
  size_t i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    pDVar1 = GC::ReadBarrier<DHUDMessage>((DHUDMessage **)&this->Messages[lVar3].field_0);
    this->Messages[lVar3].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)0x0;
    while (pDVar1 != (DHUDMessage *)0x0) {
      pDVar2 = GC::ReadBarrier<DHUDMessage>((DHUDMessage **)&pDVar1->Next);
      (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
      pDVar1 = pDVar2;
    }
  }
  return;
}

Assistant:

void DBaseStatusBar::DetachAllMessages ()
{
	for (size_t i = 0; i < countof(Messages); ++i)
	{
		DHUDMessage *probe = Messages[i];

		Messages[i] = NULL;
		while (probe != NULL)
		{
			DHUDMessage *next = probe->Next;
			probe->Destroy();
			probe = next;
		}
	}
}